

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O1

void __thiscall
llvm::dwarf::CFIProgram::printOperand
          (CFIProgram *this,raw_ostream *OS,MCRegisterInfo *MRI,bool IsEH,Instruction *Instr,
          uint OperandIdx,uint64_t Operand)

{
  byte bVar1;
  raw_ostream *prVar2;
  raw_ostream *prVar3;
  uint64_t uVar4;
  undefined *puVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]> AVar7;
  StringRef SVar8;
  format_object_base local_60;
  uint64_t local_50;
  undefined4 local_44;
  uint64_t local_40;
  raw_ostream *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000009,IsEH);
  local_38 = OS;
  if (1 < OperandIdx) {
    __assert_fail("OperandIdx < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugFrame.cpp"
                  ,0xdc,
                  "void llvm::dwarf::CFIProgram::printOperand(raw_ostream &, const MCRegisterInfo *, bool, const Instruction &, unsigned int, uint64_t) const"
                 );
  }
  local_40 = Operand;
  bVar1 = Instr->Opcode;
  AVar7 = getOperandTypes();
  prVar3 = local_38;
  if (AVar7.Length <= (ulong)bVar1) {
    __assert_fail("Index < Length && \"Invalid index!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/ArrayRef.h"
                  ,0xf0,
                  "const T &llvm::ArrayRef<llvm::dwarf::CFIProgram::OperandType[2]>::operator[](size_t) const [T = llvm::dwarf::CFIProgram::OperandType[2]]"
                 );
  }
  switch(AVar7.Data[bVar1][OperandIdx]) {
  case OT_Unset:
    Str.Length = 0xd;
    Str.Data = " Unsupported ";
    prVar2 = raw_ostream::operator<<(local_38,Str);
    pcVar6 = "second";
    if (OperandIdx == 0) {
      pcVar6 = "first";
    }
    Str_00.Length = (ulong)(OperandIdx != 0) + 5;
    Str_00.Data = pcVar6;
    prVar2 = raw_ostream::operator<<(prVar2,Str_00);
    Str_01.Length = 0xb;
    Str_01.Data = " operand to";
    raw_ostream::operator<<(prVar2,Str_01);
    SVar8 = CallFrameString((uint)bVar1,this->Arch);
    if (SVar8.Length != 0) {
      Str_02.Length = 1;
      Str_02.Data = " ";
      prVar3 = raw_ostream::operator<<(prVar3,Str_02);
      raw_ostream::operator<<(prVar3,SVar8);
      return;
    }
    local_60.Fmt = " Opcode %x";
    local_60._vptr_format_object_base = (_func_int **)&PTR_home_00d8c8e8;
    local_50 = CONCAT71(local_50._1_7_,bVar1);
    goto LAB_00afb42f;
  default:
    goto switchD_00afb244_caseD_1;
  case OT_Address:
    local_60.Fmt = " %lx";
    break;
  case OT_Offset:
    local_60.Fmt = " %+ld";
    goto LAB_00afb40d;
  case OT_FactoredCodeOffset:
    uVar4 = this->CodeAlignmentFactor;
    if (uVar4 == 0) {
      local_60.Fmt = " %ld*code_alignment_factor";
      break;
    }
LAB_00afb37f:
    puVar5 = &format_object<unsigned_long>::vtable;
LAB_00afb3c0:
    local_60.Fmt = " %ld";
    local_50 = uVar4 * local_40;
    goto LAB_00afb427;
  case OT_SignedFactDataOffset:
    uVar4 = this->DataAlignmentFactor;
    if (uVar4 != 0) {
      puVar5 = &format_object<long>::vtable;
      goto LAB_00afb3c0;
    }
    local_60.Fmt = " %ld*data_alignment_factor";
LAB_00afb40d:
    puVar5 = &format_object<long>::vtable;
    local_50 = local_40;
    goto LAB_00afb427;
  case OT_UnsignedFactDataOffset:
    uVar4 = this->DataAlignmentFactor;
    if (uVar4 != 0) goto LAB_00afb37f;
    local_60.Fmt = " %ld*data_alignment_factor";
    break;
  case OT_Register:
    local_60.Fmt = " reg%ld";
    break;
  case OT_Expression:
    if ((Instr->Expression).Storage.hasVal == false) {
      __assert_fail("Instr.Expression && \"missing DWARFExpression object\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugFrame.cpp"
                    ,0x10b,
                    "void llvm::dwarf::CFIProgram::printOperand(raw_ostream &, const MCRegisterInfo *, bool, const Instruction &, unsigned int, uint64_t) const"
                   );
    }
    SVar8.Length = 1;
    SVar8.Data = " ";
    raw_ostream::operator<<(local_38,SVar8);
    if ((Instr->Expression).Storage.hasVal != false) {
      DWARFExpression::print
                ((DWARFExpression *)&Instr->Expression,prVar3,MRI,(DWARFUnit *)0x0,local_44._0_1_);
      return;
    }
    __assert_fail("hasVal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                  ,0xb1,
                  "const T &llvm::optional_detail::OptionalStorage<llvm::DWARFExpression>::getValue() const & [T = llvm::DWARFExpression]"
                 );
  }
  puVar5 = &format_object<unsigned_long>::vtable;
  local_50 = local_40;
LAB_00afb427:
  local_60._vptr_format_object_base = (_func_int **)(puVar5 + 0x10);
LAB_00afb42f:
  raw_ostream::operator<<(prVar3,&local_60);
switchD_00afb244_caseD_1:
  return;
}

Assistant:

void CFIProgram::printOperand(raw_ostream &OS, const MCRegisterInfo *MRI,
                              bool IsEH, const Instruction &Instr,
                              unsigned OperandIdx, uint64_t Operand) const {
  assert(OperandIdx < 2);
  uint8_t Opcode = Instr.Opcode;
  OperandType Type = getOperandTypes()[Opcode][OperandIdx];

  switch (Type) {
  case OT_Unset: {
    OS << " Unsupported " << (OperandIdx ? "second" : "first") << " operand to";
    auto OpcodeName = CallFrameString(Opcode, Arch);
    if (!OpcodeName.empty())
      OS << " " << OpcodeName;
    else
      OS << format(" Opcode %x",  Opcode);
    break;
  }
  case OT_None:
    break;
  case OT_Address:
    OS << format(" %" PRIx64, Operand);
    break;
  case OT_Offset:
    // The offsets are all encoded in a unsigned form, but in practice
    // consumers use them signed. It's most certainly legacy due to
    // the lack of signed variants in the first Dwarf standards.
    OS << format(" %+" PRId64, int64_t(Operand));
    break;
  case OT_FactoredCodeOffset: // Always Unsigned
    if (CodeAlignmentFactor)
      OS << format(" %" PRId64, Operand * CodeAlignmentFactor);
    else
      OS << format(" %" PRId64 "*code_alignment_factor" , Operand);
    break;
  case OT_SignedFactDataOffset:
    if (DataAlignmentFactor)
      OS << format(" %" PRId64, int64_t(Operand) * DataAlignmentFactor);
    else
      OS << format(" %" PRId64 "*data_alignment_factor" , int64_t(Operand));
    break;
  case OT_UnsignedFactDataOffset:
    if (DataAlignmentFactor)
      OS << format(" %" PRId64, Operand * DataAlignmentFactor);
    else
      OS << format(" %" PRId64 "*data_alignment_factor" , Operand);
    break;
  case OT_Register:
    OS << format(" reg%" PRId64, Operand);
    break;
  case OT_Expression:
    assert(Instr.Expression && "missing DWARFExpression object");
    OS << " ";
    Instr.Expression->print(OS, MRI, nullptr, IsEH);
    break;
  }
}